

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

UString * jsonnet::internal::jsonnet_string_unparse
                    (UString *__return_storage_ptr__,UString *str,bool single)

{
  undefined7 in_register_00000011;
  char32_t __c;
  UStringStream ss;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_60;
  UString local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = L'\0';
  __c = (int)CONCAT71(in_register_00000011,single) * 5 + L'\"';
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_60,__c);
  jsonnet_string_escape(&local_40,str,single);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  append(&local_60,&local_40);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_60,__c);
  std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__,&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

UString jsonnet_string_unparse(const UString &str, bool single)
{
    UStringStream ss;
    ss << (single ? U'\'' : U'\"');
    ss << jsonnet_string_escape(str, single);
    ss << (single ? U'\'' : U'\"');
    return ss.str();
}